

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_unix.c
# Opt level: O0

int w_format_msg_va(char *msg,size_t msg_len,char *fmt,__va_list_tag *args)

{
  int iVar1;
  int *piVar2;
  int result;
  __va_list_tag *args_local;
  char *fmt_local;
  size_t msg_len_local;
  char *msg_local;
  
  if (msg == (char *)0x0) {
    w_abort(-1);
  }
  if (fmt == (char *)0x0) {
    w_abort(-1);
  }
  piVar2 = __errno_location();
  *piVar2 = 0;
  iVar1 = vsnprintf(msg,msg_len,fmt,args);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    msg_local._4_4_ = wp_platform_enforce_error(*piVar2);
  }
  else {
    if (msg_len <= (ulong)(long)iVar1) {
      wp_platform_truncate(msg,msg_len);
    }
    msg_local._4_4_ = 0;
  }
  return msg_local._4_4_;
}

Assistant:

int
w_format_msg_va(
    char *msg,
    size_t msg_len,
    const char *fmt,
    va_list args
)
{
    int result;

    WP_PLATFORM_ASSERT(msg != NULL);
    WP_PLATFORM_ASSERT(fmt != NULL);

    errno = 0;
    result = vsnprintf(msg, msg_len, fmt, args);
    if (result < 0)
    {
        return wp_platform_enforce_error(errno);
    }
    else if ((size_t)result >= msg_len)
    {
        wp_platform_truncate(msg, msg_len);
    }

    return 0;
}